

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::PopEvalStack
          (WasmBytecodeGenerator *this,WasmType expectedType,char16 *mismatchMessage)

{
  code *pcVar1;
  bool bVar2;
  EmitInfo EVar3;
  WasmCompilationException *pWVar4;
  char16 *pcVar5;
  char16 *pcVar6;
  undefined4 *puVar7;
  char16 *mismatchMessage_local;
  WasmType expectedType_local;
  WasmBytecodeGenerator *this_local;
  EmitInfo info;
  
  bVar2 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Empty
                    (&this->m_evalStack);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x819,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  EVar3 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
                    (&this->m_evalStack);
  this_local._4_4_ = EVar3.type;
  if (this_local._4_4_ != Limit) {
    if (((expectedType != Any) && (this_local._4_4_ != Any)) && (this_local._4_4_ != expectedType))
    {
      if (mismatchMessage != (char16 *)0x0) {
        pWVar4 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException(pWVar4,mismatchMessage);
        __cxa_throw(pWVar4,&WasmCompilationException::typeinfo,
                    WasmCompilationException::~WasmCompilationException);
      }
      pWVar4 = (WasmCompilationException *)__cxa_allocate_exception(8);
      pcVar5 = WasmTypes::GetTypeName(expectedType);
      pcVar6 = WasmTypes::GetTypeName(this_local._4_4_);
      WasmCompilationException::WasmCompilationException
                (pWVar4,L"Type mismatch. Expected %s, got %s",pcVar5,pcVar6);
      __cxa_throw(pWVar4,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    }
    if ((this_local._4_4_ == Any) && (bVar2 = IsUnreachable(this), !bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x829,"(info.type != WasmTypes::Any || IsUnreachable())",
                         "info.type != WasmTypes::Any || IsUnreachable()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    return EVar3;
  }
  pWVar4 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException(pWVar4,L"Reached end of stack");
  __cxa_throw(pWVar4,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

EmitInfo WasmBytecodeGenerator::PopEvalStack(WasmTypes::WasmType expectedType, const char16* mismatchMessage)
{
    // The scope marker should at least be there
    Assert(!m_evalStack.Empty());
    EmitInfo info = m_evalStack.Pop();
    if (info.type == WasmTypes::Limit)
    {
        throw WasmCompilationException(_u("Reached end of stack"));
    }
    if (expectedType != WasmTypes::Any &&
        info.type != WasmTypes::Any &&
        info.type != expectedType)
    {
        if (!mismatchMessage)
        {
            throw WasmCompilationException(_u("Type mismatch. Expected %s, got %s"), GetTypeName(expectedType), GetTypeName(info.type));
        }
        throw WasmCompilationException(mismatchMessage);
    }
    Assert(info.type != WasmTypes::Any || IsUnreachable());
    return info;
}